

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall datarate_test::anon_unknown_0::DatarateTestSVC::ResetModel(DatarateTestSVC *this)

{
  int i;
  long lVar1;
  int i_1;
  
  DatarateTest::ResetModel(&this->super_DatarateTest);
  this->layer_frame_cnt_ = 0;
  this->superframe_cnt_ = 0;
  this->number_temporal_layers_ = 1;
  this->number_spatial_layers_ = 1;
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    this->target_layer_bitrate_[lVar1] = 0;
    this->effective_datarate_tl[lVar1] = 0.0;
  }
  this->drop_frames_ = 0;
  memset(&this->svc_params_,0,0x234);
  for (lVar1 = 0; lVar1 != 1000; lVar1 = lVar1 + 1) {
    this->drop_frames_list_[lVar1] = 1000;
  }
  this->mismatch_nframes_ = 0;
  this->decoded_nframes_ = 0;
  this->user_define_frame_qp_ = 0;
  this->set_speed_per_layer_ = false;
  this->external_resize_dynamic_drop_layer_ = false;
  this->external_resize_pattern_ = 0;
  this->dynamic_tl_ = false;
  this->mismatch_psnr_ = 0.0;
  this->set_frame_level_er_ = 0;
  this->multi_ref_ = 0;
  this->use_fixed_mode_svc_ = 0;
  this->comp_pred_ = 0;
  this->dynamic_enable_disable_mode_ = 0;
  this->intra_only_ = 0;
  this->intra_only_single_layer_ = 0;
  this->frame_to_start_decoding_ = 0;
  this->layer_to_decode_ = 0;
  this->frame_sync_ = 0;
  this->current_video_frame_ = 0;
  this->screen_mode_ = 0;
  this->rps_mode_ = 0;
  this->rps_recovery_frame_ = 0;
  *(undefined8 *)((long)&this->rps_recovery_frame_ + 2) = 0;
  return;
}

Assistant:

void ResetModel() override {
    DatarateTest::ResetModel();
    layer_frame_cnt_ = 0;
    superframe_cnt_ = 0;
    number_temporal_layers_ = 1;
    number_spatial_layers_ = 1;
    for (int i = 0; i < AOM_MAX_LAYERS; i++) {
      target_layer_bitrate_[i] = 0;
      effective_datarate_tl[i] = 0.0;
    }
    memset(&layer_id_, 0, sizeof(aom_svc_layer_id_t));
    memset(&svc_params_, 0, sizeof(aom_svc_params_t));
    memset(&ref_frame_config_, 0, sizeof(aom_svc_ref_frame_config_t));
    memset(&ref_frame_comp_pred_, 0, sizeof(aom_svc_ref_frame_comp_pred_t));
    drop_frames_ = 0;
    for (int i = 0; i < 1000; i++) drop_frames_list_[i] = 1000;
    decoded_nframes_ = 0;
    mismatch_nframes_ = 0;
    mismatch_psnr_ = 0.0;
    set_frame_level_er_ = 0;
    multi_ref_ = 0;
    use_fixed_mode_svc_ = 0;
    comp_pred_ = 0;
    dynamic_enable_disable_mode_ = 0;
    intra_only_ = 0;
    intra_only_single_layer_ = false;
    frame_to_start_decoding_ = 0;
    layer_to_decode_ = 0;
    frame_sync_ = 0;
    current_video_frame_ = 0;
    screen_mode_ = 0;
    rps_mode_ = 0;
    rps_recovery_frame_ = 0;
    user_define_frame_qp_ = 0;
    set_speed_per_layer_ = false;
    simulcast_mode_ = false;
    use_last_as_scaled_ = false;
    use_last_as_scaled_single_ref_ = false;
    external_resize_dynamic_drop_layer_ = false;
    external_resize_pattern_ = 0;
    dynamic_tl_ = false;
  }